

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

bool P_TalkFacing(AActor *player)

{
  undefined8 angle_00;
  uint uVar1;
  bool bVar2;
  TFlags<ActorFlag4,_unsigned_int> local_74;
  undefined1 local_70 [24];
  DObject *local_58;
  double angle;
  double *__end1;
  double *__begin1;
  double (*__range1) [3];
  FTranslatedLineTarget t;
  AActor *player_local;
  
  t._24_8_ = player;
  FTranslatedLineTarget::FTranslatedLineTarget((FTranslatedLineTarget *)&__range1);
  __begin1 = P_TalkFacing::angleofs;
  __end1 = P_TalkFacing::angleofs;
  angle = (double)&AActor::UpdateRenderSectorList::SPRITE_SPACE;
  while( true ) {
    angle_00 = t._24_8_;
    if (__end1 == (double *)angle) {
      return false;
    }
    local_58 = (DObject *)*__end1;
    TAngle<double>::operator+((TAngle<double> *)(local_70 + 0x10),(double)local_58);
    TAngle<double>::TAngle((TAngle<double> *)(local_70 + 8),35.0);
    P_AimLineAttack((AActor *)local_70,(DAngle *)angle_00,128.0,
                    (FTranslatedLineTarget *)(local_70 + 0x10),(DAngle *)&__range1,(int)local_70 + 8
                    ,(AActor *)0x29,(AActor *)0x0);
    if (__range1 != (double (*) [3])0x0) break;
    __end1 = __end1 + 1;
  }
  bVar2 = false;
  if (0 < *(int *)((long)__range1[0x15] + 4)) {
    TFlags<ActorFlag4,_unsigned_int>::operator&
              (&local_74,
               (int)__range1 + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH)
              );
    uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_74);
    bVar2 = false;
    if (uVar1 == 0) {
      bVar2 = __range1[0x2f][1] != 0.0;
    }
  }
  if (!bVar2) {
    return false;
  }
  AActor::ConversationAnimation((AActor *)__range1,0);
  P_StartConversation((AActor *)__range1,(AActor *)t._24_8_,true,true);
  return true;
}

Assistant:

bool P_TalkFacing(AActor *player)
{
	static const double angleofs[] = { 0, 90./16, -90./16 };
	FTranslatedLineTarget t;

	for (double angle : angleofs)
	{
		P_AimLineAttack(player, player->Angles.Yaw + angle, TALKRANGE, &t, 35., ALF_FORCENOSMART | ALF_CHECKCONVERSATION | ALF_PORTALRESTRICT);
		if (t.linetarget != NULL)
		{
			if (t.linetarget->health > 0 && // Dead things can't talk.
				!(t.linetarget->flags4 & MF4_INCOMBAT) && // Fighting things don't talk either.
				t.linetarget->Conversation != NULL)
			{
				// Give the NPC a chance to play a brief animation
				t.linetarget->ConversationAnimation(0);
				P_StartConversation(t.linetarget, player, true, true);
				return true;
			}
			return false;
		}
	}
	return false;
}